

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.h
# Opt level: O3

DWARFDie __thiscall llvm::DWARFUnit::getDIEForOffset(DWARFUnit *this,uint64_t Offset)

{
  pointer pDVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar3;
  pointer pDVar4;
  ulong uVar5;
  DWARFDie DVar6;
  
  extractDIEsIfNeeded(this,false);
  pDVar4 = (this->DieArray).
           super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->DieArray).
           super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar4 != pDVar1) {
    if (0 < (long)pDVar1 - (long)pDVar4) {
      uVar5 = ((ulong)((long)pDVar1 - (long)pDVar4) >> 3) * -0x5555555555555555;
      do {
        uVar2 = uVar5 >> 1;
        uVar3 = uVar2;
        if (pDVar4[uVar2].Offset < Offset) {
          uVar3 = ~uVar2 + uVar5;
          pDVar4 = pDVar4 + uVar2 + 1;
        }
        uVar5 = uVar3;
      } while (0 < (long)uVar3);
    }
    if ((pDVar4 == pDVar1) || (pDVar4->Offset != Offset)) {
      pDVar4 = (pointer)0x0;
      this = (DWARFUnit *)0x0;
    }
    DVar6.Die = pDVar4;
    DVar6.U = this;
    return DVar6;
  }
  __assert_fail("!DieArray.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFUnit.h"
                ,0x1dc,"DWARFDie llvm::DWARFUnit::getDIEForOffset(uint64_t)");
}

Assistant:

DWARFDie getDIEForOffset(uint64_t Offset) {
    extractDIEsIfNeeded(false);
    assert(!DieArray.empty());
    auto It =
        llvm::partition_point(DieArray, [=](const DWARFDebugInfoEntry &DIE) {
          return DIE.getOffset() < Offset;
        });
    if (It != DieArray.end() && It->getOffset() == Offset)
      return DWARFDie(this, &*It);
    return DWARFDie();
  }